

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser_test.cc
# Opt level: O2

void __thiscall DyndepParserTestEmpty::Run(DyndepParserTestEmpty *this)

{
  Test *pTVar1;
  bool bVar2;
  allocator<char> local_11a;
  char kInput [1];
  string err;
  string local_f8;
  DyndepParser parser;
  
  kInput[0] = '\0';
  DyndepParser::DyndepParser
            (&parser,&(this->super_DyndepParserTest).state_,
             (FileReader *)&(this->super_DyndepParserTest).fs_,
             &(this->super_DyndepParserTest).dyndep_file_);
  pTVar1 = g_current_test;
  err._M_dataplus._M_p = (pointer)&err.field_2;
  err._M_string_length = 0;
  err.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,kInput,&local_11a);
  bVar2 = DyndepParser::ParseTest(&parser,&local_f8,&err);
  testing::Test::Check
            (pTVar1,!bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/dyndep_parser_test.cc"
             ,0x34,"parser.ParseTest(kInput, &err)");
  std::__cxx11::string::~string((string *)&local_f8);
  pTVar1 = g_current_test;
  bVar2 = std::operator==("input:1: expected \'ninja_dyndep_version = ...\'\n",&err);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/dyndep_parser_test.cc"
             ,0x35,"\"input:1: expected \'ninja_dyndep_version = ...\'\\n\" == err");
  std::__cxx11::string::~string((string *)&err);
  DyndepParser::~DyndepParser(&parser);
  return;
}

Assistant:

TEST_F(DyndepParserTest, Empty) {
  const char kInput[] =
"";
  DyndepParser parser(&state_, &fs_, &dyndep_file_);
  string err;
  EXPECT_FALSE(parser.ParseTest(kInput, &err));
  EXPECT_EQ("input:1: expected 'ninja_dyndep_version = ...'\n", err);
}